

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# role.c
# Opt level: O0

char * Hello(monst *mtmp)

{
  bool bVar1;
  monst *mtmp_local;
  
  switch(urole.malenum) {
  case 0x15f:
    mtmp_local = (monst *)anon_var_dwarf_97a1f;
    break;
  case 0x160:
    mtmp_local = (monst *)anon_var_dwarf_97a2b;
    break;
  default:
    mtmp_local = (monst *)anon_var_dwarf_97a67;
    break;
  case 0x165:
    bVar1 = false;
    if (mtmp != (monst *)0x0) {
      bVar1 = mtmp->data == mons + 0x11a;
    }
    mtmp_local = (monst *)"Konnichi wa";
    if (bVar1) {
      mtmp_local = (monst *)"Irasshaimase";
    }
    break;
  case 0x166:
    mtmp_local = (monst *)anon_var_dwarf_97a4f;
    break;
  case 0x167:
    mtmp_local = (monst *)anon_var_dwarf_97a5b;
  }
  return (char *)mtmp_local;
}

Assistant:

const char *Hello(struct monst *mtmp)
{
	switch (Role_switch) {
	case PM_KNIGHT:
	    return "Salutations"; /* Olde English */
	case PM_MONK:
	    return "Namaste";     /* Sanskrit */
	case PM_SAMURAI:
	    return (mtmp && mtmp->data == &mons[PM_SHOPKEEPER] ?
	    		"Irasshaimase" : "Konnichi wa"); /* Japanese */
	case PM_TOURIST:
	    return "Aloha";       /* Hawaiian */
	case PM_VALKYRIE:
	    return "Velkommen";   /* Norse */
	default:
	    return "Hello";
	}
}